

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

ostream * Hex::operator<<(ostream *os,Hexdumper<unsigned_char> *hd)

{
  Hexdumper<unsigned_char> *hd_local;
  ostream *os_local;
  
  Hexdumper<unsigned_char>::dump(hd,os);
  std::ios_base::width((ios_base *)(os + *(long *)(*(long *)os + -0x18)),0);
  std::ios::fill((char)os + (char)*(undefined8 *)(*(long *)os + -0x18));
  std::ios_base::precision((ios_base *)(os + *(long *)(*(long *)os + -0x18)),0);
  std::ios_base::flags
            ((ios_base *)(os + *(long *)(*(long *)os + -0x18)),
             ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream&os, const Hexdumper<T>& hd)
    {
        hd.dump(os);

        // reset stream settings
        os.width(0);
        os.fill(0);
        os.precision(0);
        os.flags(std::ios_base::fmtflags(0));
        return os;
    }